

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trmm.hpp
# Opt level: O1

void remora::bindings::
     trmm_impl<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::triangular_tag<false,false>>
               (long *e1,size_type *e2)

{
  ulong uVar1;
  size_t __n;
  size_type sVar2;
  long lVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  pointer __ptr;
  pointer __ptr_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double *__s;
  ulong uVar13;
  long lVar14;
  long lVar15;
  size_type sVar16;
  ulong uVar17;
  aligned_allocator<double,_64UL> allocator;
  long local_120;
  long local_110;
  long local_100;
  ulong local_f8;
  type Bs;
  type As;
  
  __ptr = boost::alignment::aligned_allocator<double,_64UL>::allocate
                    (&allocator,0x4000,(const_void_pointer)0x0);
  __ptr_00 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (&allocator,0x1fe00,(const_void_pointer)0x0);
  sVar2 = e2[1];
  uVar1 = sVar2 + 0x3fb;
  if (0x3fb < uVar1) {
    lVar3 = e1[1];
    sVar4 = *e2;
    uVar11 = lVar3 + 0x7fU >> 7;
    local_110 = e2[2] + uVar11 * 0x400 + -0x400;
    uVar10 = 0;
    do {
      uVar7 = sVar2 + uVar10 * -0x3fc;
      if (0x3fb < uVar7) {
        uVar7 = 0x3fc;
      }
      if (0x7f < lVar3 + 0x7fU) {
        local_100 = local_110;
        uVar9 = 0;
        local_120 = uVar11 * 0x400;
        local_f8 = lVar3 + uVar11 * -0x80;
        do {
          local_f8 = local_f8 + 0x80;
          local_120 = local_120 + -0x400;
          uVar8 = ~uVar9 + uVar11;
          uVar12 = lVar3 + uVar8 * -0x80;
          if (0x7f < uVar12) {
            uVar12 = 0x80;
          }
          Bs.m_leading_dimension = *e2;
          Bs.m_values = (double *)
                        (uVar8 * 0x400 + e2[2] + Bs.m_leading_dimension * uVar10 * 0x3fc * 8);
          Bs.m_size1 = uVar12;
          Bs.m_size2 = uVar7;
          pack_B_dense<remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>>
                    (&Bs);
          sVar6 = Bs.m_leading_dimension;
          sVar5 = Bs.m_size1;
          if (Bs.m_size2 != 0) {
            __n = Bs.m_size1 * 8;
            __s = Bs.m_values;
            sVar16 = Bs.m_size2;
            do {
              if (sVar5 != 0) {
                memset(__s,0,__n);
              }
              __s = __s + sVar6;
              sVar16 = sVar16 - 1;
            } while (sVar16 != 0);
          }
          if (uVar8 < uVar11) {
            uVar17 = 0xffffffffffffffff;
            uVar8 = local_f8;
            lVar14 = local_100;
            lVar15 = local_120;
            do {
              uVar13 = 0x80;
              if (uVar8 < 0x80) {
                uVar13 = uVar8;
              }
              As.m_leading_dimension = e1[3];
              As.m_values = (double *)(local_120 * As.m_leading_dimension + *e1 + lVar15);
              As.m_size1 = uVar13;
              As.m_size2 = uVar12;
              if (uVar17 == 0xffffffffffffffff) {
                pack_A_triangular<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>,false>
                          (&As,__ptr);
              }
              else {
                pack_A_dense<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>>
                          ();
              }
              mgemm<double,double,remora::bindings::trmm_block_size<double>>
                        (0x3ff0000000000000,uVar13,uVar7,uVar12,__ptr,__ptr_00,lVar14,1,sVar4);
              uVar17 = uVar17 + 1;
              lVar14 = lVar14 + 0x400;
              lVar15 = lVar15 + 0x400;
              uVar8 = uVar8 - 0x80;
            } while (uVar9 != uVar17);
          }
          uVar9 = uVar9 + 1;
          local_100 = local_100 + -0x400;
        } while (uVar9 != uVar11);
      }
      uVar10 = uVar10 + 1;
      local_110 = local_110 + sVar4 * 0x1fe0;
    } while (uVar10 != uVar1 / 0x3fc);
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void trmm_impl(
	matrix_expression<E1, cpu_tag> const& e1,
	matrix_expression<E2, cpu_tag> & e2,
	Triangular t
){
	typedef typename std::common_type<typename E1::value_type, typename E2::value_type>::type value_type;
	typedef trmm_block_size<value_type> block_size;

	static const std::size_t AC = block_size::lhs_block_size;
	static const std::size_t BC = block_size::rhs_column_size;

	//obtain uninitialized aligned storage
	boost::alignment::aligned_allocator<value_type,block_size::block::align> allocator;
	value_type* A = allocator.allocate(AC * AC);
	value_type* B = allocator.allocate(AC * BC);

	//figure out number of blocks to use
	const std::size_t  M = e1().size1();
	const std::size_t  N = e2().size2();
	const std::size_t Ab = (M+AC-1) / AC;
	const std::size_t Bb = (N+BC-1) / BC;

	//get access to raw storage of B
	auto storageB = e2().raw_storage();
	auto Bpointer = storageB.values;
	const std::size_t stride1 = E2::orientation::index_M(storageB.leading_dimension,1);
	const std::size_t stride2 = E2::orientation::index_m(storageB.leading_dimension,1);

	for (std::size_t j = 0; j < Bb; ++j) {//columns of B
		std::size_t nc = std::min(BC, N - j * BC);
		//We have to make use of the triangular nature of B and the fact that rhs and storage are the same matrix
		//for upper triangular matrices we can compute whole columns of A starting from the first
		//until we reach the block on the diagonal, where we stop.
		//for lower triangular matrices we start with the last column instead.
		for (std::size_t k0 = 0; k0< Ab; ++k0){//row-blocks of B = column blocks of A.
			std::size_t k = Triangular::is_upper? k0: Ab-k0-1;
			std::size_t kc = std::min(AC, M - k * AC);
			//read block of B
			auto Bs = subrange(e2, k*AC, k*AC + kc, j * BC, j * BC + nc );
			pack_B_dense(Bs, B, block_size());
			Bs.clear();//its going to be overwritten with the result

			//apply block of B to all blocks of A needing it. we will overwrite the real B block as a result of this.
			//this is okay as the block is stored as argument
			std::size_t i_start = Triangular::is_upper? 0: k;
			std::size_t i_end = Triangular::is_upper? k+1: Ab;
			for (std::size_t i = i_start; i < i_end; ++i) {
				std::size_t mc = std::min(AC, M - i * AC);
				auto As = subrange(e1, i * AC, i * AC + mc, k * AC, k * AC + kc);
				if(i == k){
					pack_A_triangular(As, A, block_size(), t);
				}else
					pack_A_dense(As, A, block_size());

				mgemm(
					mc, nc, kc, value_type(1.0), A, B,
					&Bpointer[i*AC * stride1 + j*BC * stride2], stride1, stride2, block_size()
				);
			}
		}
	}
	//free storage
	allocator.deallocate(A,AC * AC);
	allocator.deallocate(B,AC * BC);
}